

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_2dVector * __thiscall ON_2dVector::operator=(ON_2dVector *this,float *v)

{
  ON_2dVector OVar1;
  double dVar2;
  double dVar3;
  
  if (v == (float *)0x0) {
    dVar2 = 0.0;
    dVar3 = 0.0;
  }
  else {
    dVar2 = (double)(float)*(undefined8 *)v;
    dVar3 = (double)(float)((ulong)*(undefined8 *)v >> 0x20);
  }
  OVar1.y._0_4_ = SUB84(dVar3,0);
  OVar1.x = dVar2;
  OVar1.y._4_4_ = (int)((ulong)dVar3 >> 0x20);
  *this = OVar1;
  return this;
}

Assistant:

ON_2dVector& ON_2dVector::operator=(const float* v)
{
  if ( v ) {
    x = (double)v[0];
    y = (double)v[1];
  }
  else {
    x = y = 0.0;
  }
  return *this;
}